

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash.cpp
# Opt level: O3

int binary::putUvarint(Bytes *buf,UInt val)

{
  pointer puVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)val;
  uVar4 = 0;
  if (0x7f < val) {
    uVar4 = 0;
    do {
      puVar1 = (buf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(buf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) <= uVar4)
      goto LAB_00110559;
      uVar2 = (uint)uVar3;
      puVar1[uVar4] = (byte)uVar3 | 0x80;
      uVar3 = uVar3 >> 7;
      uVar4 = uVar4 + 1;
    } while (0x3fff < uVar2);
  }
  puVar1 = (buf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((uVar4 & 0xffffffff) <
      (ulong)((long)(buf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                    .super__Vector_impl_data._M_finish - (long)puVar1)) {
    puVar1[uVar4 & 0xffffffff] = (uchar)uVar3;
    return (int)uVar4 + 1;
  }
LAB_00110559:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

int putUvarint(Bytes &buf, UInt val) {
	int i{};
	unsigned char x{};

	while (val >= 0x80) {
		x = (unsigned char)(val);
		buf.at(i) = x | 0x80;
		val >>= 7;
		i++;
	}
	x = (unsigned char)(val);
	buf.at(i) = x;
	return i + 1;
}